

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

ValueType __thiscall
draco::PointAttribute::DeduplicateTypedValues<signed_char>
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  uint8_t uVar1;
  GeometryAttribute *in_RSI;
  GeometryAttribute *in_stack_00000100;
  PointAttribute *in_stack_00000108;
  AttributeValueIndex in_stack_00000110;
  ValueType local_4;
  
  uVar1 = GeometryAttribute::num_components(in_RSI);
  switch(uVar1) {
  case '\x01':
    local_4 = DeduplicateFormattedValues<signed_char,1>
                        (in_stack_00000108,in_stack_00000100,in_stack_00000110);
    break;
  case '\x02':
    local_4 = DeduplicateFormattedValues<signed_char,2>
                        (in_stack_00000108,in_stack_00000100,in_stack_00000110);
    break;
  case '\x03':
    local_4 = DeduplicateFormattedValues<signed_char,3>
                        (in_stack_00000108,in_stack_00000100,in_stack_00000110);
    break;
  case '\x04':
    local_4 = DeduplicateFormattedValues<signed_char,4>
                        (in_stack_00000108,in_stack_00000100,in_stack_00000110);
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateTypedValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  // Select the correct method to call based on the number of attribute
  // components.
  switch (in_att.num_components()) {
    case 1:
      return DeduplicateFormattedValues<T, 1>(in_att, in_att_offset);
    case 2:
      return DeduplicateFormattedValues<T, 2>(in_att, in_att_offset);
    case 3:
      return DeduplicateFormattedValues<T, 3>(in_att, in_att_offset);
    case 4:
      return DeduplicateFormattedValues<T, 4>(in_att, in_att_offset);
    default:
      return 0;
  }
}